

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O1

int Maj3_ManAddCnf(Maj3_Man_t *p,int iMint)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  int *piVar11;
  int *piVar12;
  long lVar13;
  ulong uVar14;
  byte bVar15;
  bool bVar16;
  int pLits [5];
  int *local_98;
  int local_88 [6];
  int *local_70;
  int *local_68;
  int (*local_60) [32];
  ulong local_58;
  long local_50;
  long local_48;
  ulong local_40;
  int (*local_38) [32];
  
  lVar2 = (long)p->nVars;
  if (0 < lVar2) {
    lVar5 = 0;
    do {
      p->ObjVals[lVar5] = (uint)(((uint)iMint >> ((uint)lVar5 & 0x1f) & 1) != 0);
      lVar5 = lVar5 + 1;
    } while (lVar2 != lVar5);
  }
  if ((p->ObjVals[0] == 0) ||
     ((uVar3 = 1, p->ObjVals[1] == 0 && ((p->ObjVals[0] == 0 || (p->ObjVals[2] == 0)))))) {
    if (p->ObjVals[1] == 0) {
      uVar3 = 0;
    }
    else {
      uVar3 = (uint)(p->ObjVals[2] != 0);
    }
  }
  p->ObjVals[lVar2] = uVar3;
  uVar3 = p->nVars;
  iVar4 = 0;
  if (0 < (int)uVar3) {
    uVar6 = 0;
    do {
      iVar4 = iVar4 + (uint)(((uint)iMint >> (uVar6 & 0x1f) & 1) != 0);
      uVar6 = uVar6 + 1;
    } while (uVar3 != uVar6);
  }
  p->ObjVals[(long)p->nObjs + -1] = (uint)((int)uVar3 / 2 < iVar4);
  if (p->nVars + 1 < p->nObjs + -1) {
    lVar2 = (long)p->nVars + 0x40b;
    do {
      iVar4 = p->iVar;
      p->iVar = iVar4 + 1;
      *(int *)((long)(p->VarMarks + -1) + 0x58 + lVar2 * 4) = iVar4;
      lVar5 = lVar2 + -0x409;
      lVar2 = lVar2 + 1;
    } while (lVar5 < (long)p->nObjs + -1);
  }
  bmcg_sat_solver_set_nvars(p->pSat,p->iVar);
  local_60 = p->VarMarks;
  local_68 = p->ObjVals + 1;
  local_70 = p->VarMarks[1] + 1;
  uVar3 = 0;
  do {
    iVar4 = p->nVars;
    if (iVar4 + 1 < p->nObjs) {
      uVar6 = uVar3 ^ 1;
      lVar2 = (long)iVar4 + 1;
      local_98 = local_70 + (long)iVar4 * 0x20;
      do {
        if (0 < p->nObjs) {
          lVar5 = 1;
          local_38 = local_60 + lVar2;
          lVar13 = 0;
          piVar11 = local_68;
          piVar12 = local_98;
          do {
            iVar4 = (*local_38)[lVar13];
            if (0 < iVar4) {
              uVar1 = p->ObjVals[lVar13];
              bVar15 = 0;
              if (uVar1 != uVar6) {
                bVar16 = 1 < (int)uVar1;
                if (bVar16) {
                  local_88[0] = uVar3 + uVar1 * 2;
                }
                uVar14 = (ulong)bVar16;
                if (iVar4 != 1) {
                  uVar14 = (ulong)(bVar16 + 1);
                  local_88[bVar16] = iVar4 * 2 + 1;
                }
                if (lVar13 + 1 < (long)p->nObjs) {
                  iVar4 = (int)uVar14;
                  lVar10 = 0;
                  local_58 = uVar14;
                  local_50 = lVar13;
                  local_48 = lVar5;
                  local_40 = uVar14;
                  do {
                    iVar7 = piVar12[lVar10];
                    if (0 < iVar7) {
                      uVar1 = piVar11[lVar10];
                      bVar15 = 0x13;
                      if (uVar1 != uVar6) {
                        uVar8 = uVar14 & 0xffffffff;
                        if (1 < (int)uVar1) {
                          local_88[local_40] = uVar3 + uVar1 * 2;
                          uVar8 = (ulong)(iVar4 + 1);
                        }
                        uVar9 = uVar8;
                        if (iVar7 != 1) {
                          uVar9 = (ulong)((int)uVar8 + 1);
                          local_88[uVar8] = iVar7 * 2 + 1;
                        }
                        iVar7 = (int)uVar9;
                        uVar1 = p->ObjVals[lVar2];
                        if (uVar1 != uVar3) {
                          if (1 < (int)uVar1) {
                            iVar7 = iVar7 + 1;
                            local_88[uVar9] = uVar6 + uVar1 * 2;
                          }
                          if (4 < iVar7 - 1U) {
                            __assert_fail("nLits2 > 0 && nLits2 <= 5",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj3.c"
                                          ,0x16f,"int Maj3_ManAddCnf(Maj3_Man_t *, int)");
                          }
                          iVar7 = bmcg_sat_solver_addclause(p->pSat,local_88,iVar7);
                          bVar15 = iVar7 == 0;
                          lVar5 = local_48;
                          lVar13 = local_50;
                          uVar14 = local_58;
                        }
                      }
                      if ((bVar15 != 0x13) && (bVar15 != 0)) goto LAB_005a3fd7;
                    }
                    lVar10 = lVar10 + 1;
                  } while ((int)lVar5 + (int)lVar10 < p->nObjs);
                }
                bVar15 = 0;
              }
LAB_005a3fd7:
              if ((bVar15 & 0xf) != 0) {
                return 0;
              }
            }
            lVar13 = lVar13 + 1;
            lVar5 = lVar5 + 1;
            piVar11 = piVar11 + 1;
            piVar12 = piVar12 + 1;
          } while (lVar13 < p->nObjs);
        }
        lVar2 = lVar2 + 1;
        local_98 = local_98 + 0x20;
      } while (lVar2 < p->nObjs);
    }
    bVar16 = uVar3 != 0;
    uVar3 = uVar3 + 1;
    if (bVar16) {
      return 1;
    }
  } while( true );
}

Assistant:

int Maj3_ManAddCnf( Maj3_Man_t * p, int iMint )
{
    // input values
    int i, k, j, n, * pVals = p->ObjVals;
    for ( i = 0; i < p->nVars; i++ )
        pVals[i] = (iMint >> i) & 1;
    // first node value
    pVals[p->nVars] = (pVals[0] && pVals[1]) || (pVals[0] && pVals[2]) || (pVals[1] && pVals[2]);
    // last node value
    pVals[p->nObjs-1] = Maj3_ManValue(iMint, p->nVars);
    // intermediate node values
    for ( i = p->nVars + 1; i < p->nObjs - 1; i++ )
        pVals[i] = p->iVar++;
    //printf( "Adding clauses for minterm %d.\n", iMint );
    bmcg_sat_solver_set_nvars( p->pSat, p->iVar );
    for ( n = 0; n < 2; n++ )
    for ( i = p->nVars + 1; i < p->nObjs; i++ )
    {
        //printf( "\nNode %d. Phase %d.\n", i, n );
        for ( k = 0; k < p->nObjs; k++ ) if ( p->VarMarks[i][k] >= 1 )
        {
            // add first input
            int pLits[5], nLits = 0;
            if ( pVals[k] == !n )
                continue;
            if ( pVals[k] > 1 )
                pLits[nLits++] = Abc_Var2Lit( pVals[k], n );
            if ( p->VarMarks[i][k] > 1 )
                pLits[nLits++] = Abc_Var2Lit( p->VarMarks[i][k], 1 );
            for ( j = k+1; j < p->nObjs; j++ ) if ( p->VarMarks[i][j] >= 1 )
            {
                // add second input
                int nLits2 = nLits;
                if ( pVals[j] == !n )
                    continue;
                if ( pVals[j] > 1 )
                    pLits[nLits2++] = Abc_Var2Lit( pVals[j], n );
                if ( p->VarMarks[i][j] > 1 )
                    pLits[nLits2++] = Abc_Var2Lit( p->VarMarks[i][j], 1 );
                // add output
                if ( pVals[i] == n )
                    continue;
                if ( pVals[i] > 1 )
                    pLits[nLits2++] = Abc_Var2Lit( pVals[i], !n );
                assert( nLits2 > 0 && nLits2 <= 5 );
                //Maj3_PrintClause( pLits, nLits2 );
                if ( !bmcg_sat_solver_addclause( p->pSat, pLits, nLits2 ) )
                    return 0;
            }
        }
    }
    return 1;
}